

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstDebugPrintfPass::NewMemberName
          (InstDebugPrintfPass *this,uint32_t id,uint32_t member_index,string *name_str)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  undefined4 in_register_00000034;
  __uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
  in_R8;
  Operand *local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  SmallVector<unsigned_int,_2UL> local_188;
  uint local_15c;
  iterator local_158;
  undefined8 local_150;
  SmallVector<unsigned_int,_2UL> local_148;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  Operand local_e0;
  Operand OStack_b0;
  Operand OStack_80;
  Operand local_50;
  string *name_str_local;
  uint32_t member_index_local;
  uint32_t id_local;
  InstDebugPrintfPass *this_local;
  
  _member_index_local = (Pass *)CONCAT44(in_register_00000034,id);
  name_str_local._0_4_ = (uint)name_str;
  local_50.words.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )in_R8.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  name_str_local._4_4_ = member_index;
  this_local = this;
  local_50.words.small_data_ = (uint *)Pass::context(_member_index_local);
  local_50.words.buffer[1].data._M_elems = (array<signed_char,_4UL>)(_Type)0x6;
  local_50.words.buffer[0].data._M_elems = (array<signed_char,_4UL>)(_Type)0x0;
  local_50.words.size_._4_4_ = 0;
  local_11c = name_str_local._4_4_;
  local_118 = &local_11c;
  local_110 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_118;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list_00);
  Operand::Operand(&local_e0,SPV_OPERAND_TYPE_ID,&local_108);
  local_15c = (uint)name_str_local;
  local_158 = &local_15c;
  local_150 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_158;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_148,init_list);
  Operand::Operand(&OStack_b0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_148);
  utils::MakeVector(&local_1a0,
                    (string *)
                    local_50.words.large_data_._M_t.
                    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                    ._M_head_impl);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_188,&local_1a0);
  Operand::Operand(&OStack_80,SPV_OPERAND_TYPE_LITERAL_STRING,&local_188);
  local_50._0_8_ = &local_e0;
  local_50.words._vptr_SmallVector = (_func_int **)0x3;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,(IRContext **)&local_50.words.small_data_,
             (Op *)(local_50.words.buffer + 1),(int *)local_50.words.buffer,
             (int *)((long)&local_50.words.size_ + 4),
             (initializer_list<spvtools::opt::Operand> *)&local_50);
  local_1a8 = &local_50;
  do {
    local_1a8 = local_1a8 + -1;
    Operand::~Operand(local_1a8);
  } while (local_1a8 != &local_e0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_188);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_148);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstDebugPrintfPass::NewMemberName(
    uint32_t id, uint32_t member_index, const std::string& name_str) {
  return MakeUnique<Instruction>(
      context(), spv::Op::OpMemberName, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {id}},
          {SPV_OPERAND_TYPE_LITERAL_INTEGER, {member_index}},
          {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}});
}